

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<_std::is_class<typename_std::decay_t<float_&>_>::value,_void>
pbrt::detail::stringPrintfRecursiveWithPrecision<float&,float&>
          (string *s,char *fmt,string *nextFmt,int precision,float *v,float *args)

{
  int iVar1;
  undefined4 in_register_0000000c;
  string str;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  iVar1 = snprintf((char *)0x0,0,(nextFmt->_M_dataplus)._M_p,(double)*v,
                   CONCAT44(in_register_0000000c,precision));
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = '\0';
  std::__cxx11::string::resize((ulong)&local_50);
  snprintf(local_50,(long)(iVar1 + 1),(nextFmt->_M_dataplus)._M_p,(double)*v,(ulong)(uint)precision)
  ;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((string *)s);
  stringPrintfRecursive<float&>(s,fmt,args);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

inline typename std::enable_if_t<!std::is_class<typename std::decay_t<T>>::value, void>
stringPrintfRecursiveWithPrecision(std::string *s, const char *fmt,
                                   const std::string &nextFmt, int precision, T &&v,
                                   Args &&... args) {
    size_t size = snprintf(nullptr, 0, nextFmt.c_str(), precision, v) + 1;
    std::string str;
    str.resize(size);
    snprintf(&str[0], size, nextFmt.c_str(), precision, v);
    str.pop_back();  // remove trailing NUL
    *s += str;

    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}